

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageLevel.cpp
# Opt level: O1

void __thiscall Imf_3_2::ImageLevel::throwBadChannelName(ImageLevel *this,string *name)

{
  ostream *poVar1;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Attempt to access non-existent image channel \"",0x2e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageLevel::throwBadChannelName (const string& name) const
{
    THROW (
        ArgExc,
        "Attempt to access non-existent "
        "image channel \""
            << name << "\".");
}